

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O2

Raster * rw::Raster::create(int32 width,int32 height,int32 depth,int32 format,int32 platform)

{
  int *object;
  Raster *pRVar1;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/raster.cpp line: 61"
  ;
  object = (int *)(*Engine::memfuncs)((long)s_plglist,0x30000);
  numAllocated = numAllocated + 1;
  *(int **)(object + 0x14) = object;
  object[0x16] = 0;
  object[0x17] = 0;
  if (platform == 0) {
    platform = rw::platform;
  }
  *object = platform;
  object[1] = format & 7;
  object[2] = format & 0xf8;
  object[3] = 0;
  object[4] = format & 0xff00;
  object[5] = width;
  object[6] = height;
  object[7] = depth;
  object[8] = 0;
  object[10] = 0;
  object[0xb] = 0;
  object[0xc] = 0;
  object[0xd] = 0;
  PluginList::construct((PluginList *)&s_plglist,object);
  pRVar1 = (Raster *)(**(code **)(*(long *)(engine + 0x58 + (long)*object * 8) + 0x10))(object);
  return pRVar1;
}

Assistant:

Raster*
Raster::create(int32 width, int32 height, int32 depth, int32 format, int32 platform)
{
	// TODO: pass arguments through to the driver and create the raster there
	Raster *raster = (Raster*)rwMalloc(s_plglist.size, MEMDUR_EVENT);	// TODO
	assert(raster != nil);
	numAllocated++;
	raster->parent = raster;
	raster->offsetX = 0;
	raster->offsetY = 0;
	raster->platform = platform ? platform : rw::platform;
	raster->type = format & 0x7;
	raster->flags = format & 0xF8;
	raster->privateFlags = 0;
	raster->format = format & 0xFF00;
	raster->width = width;
	raster->height = height;
	raster->depth = depth;
	raster->stride = 0;
	raster->pixels = raster->palette = nil;
	s_plglist.construct(raster);

//	printf("%d %d %d %d\n", raster->type, raster->width, raster->height, raster->depth);
	return engine->driver[raster->platform]->rasterCreate(raster);
}